

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAbsoluteAABB.h
# Opt level: O2

int __thiscall
chrono::collision::ChAbsoluteAABB<chrono::collision::ChCollisionTree>::init
          (ChAbsoluteAABB<chrono::collision::ChCollisionTree> *this,EVP_PKEY_CTX *ctx)

{
  int in_EAX;
  
  if (this->m_model == (ChCollisionTree *)0x0) {
    this->m_model = (ChCollisionTree *)ctx;
    ChIntervalEndpoint<chrono::collision::ChCollisionTree>::init(&this->m_beginX,ctx);
    ChIntervalEndpoint<chrono::collision::ChCollisionTree>::init(&this->m_beginY,ctx);
    ChIntervalEndpoint<chrono::collision::ChCollisionTree>::init(&this->m_beginZ,ctx);
    ChIntervalEndpoint<chrono::collision::ChCollisionTree>::init(&this->m_endX,ctx);
    ChIntervalEndpoint<chrono::collision::ChCollisionTree>::init(&this->m_endY,ctx);
    in_EAX = ChIntervalEndpoint<chrono::collision::ChCollisionTree>::init(&this->m_endZ,ctx);
    if (this->m_model == (ChCollisionTree *)0x0) {
      __assert_fail("m_model",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/edgetempest/ChCAbsoluteAABB.h"
                    ,0x3f,
                    "void chrono::collision::ChAbsoluteAABB<chrono::collision::ChCollisionTree>::init(coll_model_type *) [coll_model_type = chrono::collision::ChCollisionTree]"
                   );
    }
  }
  return in_EAX;
}

Assistant:

void init(coll_model_type* amodel) {
        if (!m_model) {
            m_model = amodel;
            m_beginX.init(amodel, 0);
            m_beginY.init(amodel, 0);
            m_beginZ.init(amodel, 0);
            m_endX.init(amodel, 1);
            m_endY.init(amodel, 1);
            m_endZ.init(amodel, 1);
        }
        assert(m_model);
    }